

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderPiplineProgramObjectWithoutActiveVSProgramTest::deinit
          (GeometryShaderPiplineProgramObjectWithoutActiveVSProgramTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_fs_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_fs_po_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_gs_id = 0;
  }
  if (this->m_gs_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_gs_po_id = 0;
  }
  if (this->m_ppo_id != 0) {
    (**(code **)(lVar2 + 0x450))(1,&this->m_ppo_id);
    this->m_ppo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderPiplineProgramObjectWithoutActiveVSProgramTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_fs_po_id != 0)
	{
		gl.deleteProgram(m_fs_po_id);
		m_fs_po_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
		m_gs_id = 0;
	}

	if (m_gs_po_id != 0)
	{
		gl.deleteProgram(m_gs_po_id);
		m_gs_po_id = 0;
	}

	if (m_ppo_id != 0)
	{
		gl.deleteProgramPipelines(1, &m_ppo_id);
		m_ppo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}